

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O1

void __thiscall
ser::Serializer::Init(Serializer *this,string *directory,string *prefix,SerializerOpenMode mode)

{
  MetainfoSet *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  int iVar3;
  char *pcVar4;
  CentralizedFileFormat *p;
  long lVar5;
  const_iterator cVar6;
  shared_ptr<ser::CentralizedFileFormat> fileFormat;
  key_type local_80;
  shared_ptr<ser::CentralizedFileFormat> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (enabled_ == 0) {
    pcVar4 = getenv("STELLA_SERIALIZATION_DISABLED");
    if (pcVar4 == (char *)0x0) {
      enabled_ = 1;
    }
    else {
      iVar3 = atoi(pcVar4);
      enabled_ = (uint)(iVar3 < 1) * 2 + -1;
    }
  }
  this->mode_ = mode;
  p = (CentralizedFileFormat *)operator_new(0x80);
  (p->super_FileFormat).directory_._M_dataplus._M_p =
       (pointer)&(p->super_FileFormat).directory_.field_2;
  (p->super_FileFormat).directory_._M_string_length = 0;
  (p->super_FileFormat).directory_.field_2._M_local_buf[0] = '\0';
  (p->super_FileFormat).prefix_._M_dataplus._M_p = (pointer)&(p->super_FileFormat).prefix_.field_2;
  (p->super_FileFormat).prefix_._M_string_length = 0;
  (p->super_FileFormat).prefix_.field_2._M_local_buf[0] = '\0';
  (p->super_FileFormat)._vptr_FileFormat = (_func_int **)&PTR__CentralizedFileFormat_00138cc8;
  (p->databaseFile_)._M_dataplus._M_p = (pointer)&(p->databaseFile_).field_2;
  (p->databaseFile_)._M_string_length = 0;
  (p->databaseFile_).field_2._M_local_buf[0] = '\0';
  boost::shared_ptr<ser::CentralizedFileFormat>::shared_ptr<ser::CentralizedFileFormat>(&local_60,p)
  ;
  if (local_60.px == (CentralizedFileFormat *)0x0) {
    pcVar4 = 
    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<ser::CentralizedFileFormat>::operator->() const [T = ser::CentralizedFileFormat]"
    ;
  }
  else {
    this_00 = &this->globalMetainfo_;
    CentralizedFileFormat::Init
              (local_60.px,directory,prefix,this_00,&this->fieldsTable_,&this->offsetTable_);
    boost::shared_ptr<ser::FileFormat>::operator=(&this->pFileFormat_,&local_60);
    peVar2 = (this->pFileFormat_).px;
    if (this->mode_ == SerializerOpenModeWrite) {
      lVar5 = 0x28;
    }
    else {
      lVar5 = 0x18;
    }
    if (peVar2 != (element_type *)0x0) {
      (**(code **)((long)peVar2->_vptr_FileFormat + lVar5))();
      paVar1 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"__format","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                      *)this_00,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((_Rb_tree_header *)cVar6._M_node !=
          &(this->globalMetainfo_).data_._M_t._M_impl.super__Rb_tree_header) {
LAB_0011e64a:
        boost::detail::shared_count::~shared_count(&local_60.pn);
        return;
      }
      local_80._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"__format","");
      peVar2 = (this->pFileFormat_).px;
      if (peVar2 != (element_type *)0x0) {
        (*peVar2->_vptr_FileFormat[2])(&local_50);
        MetainfoSet::AddMetainfo<std::__cxx11::string>(this_00,&local_80,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar1) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        goto LAB_0011e64a;
      }
    }
    pcVar4 = 
    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<ser::FileFormat>::operator->() const [T = ser::FileFormat]"
    ;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,pcVar4);
}

Assistant:

void Serializer::Init(const std::string& directory, const std::string& prefix, SerializerOpenMode mode)
{
    // Set the enabled_ flag to something different than 0
    if (enabled_ == 0)
    {
        const char* envvar = std::getenv("STELLA_SERIALIZATION_DISABLED");
        enabled_ = (envvar && std::atoi(envvar) > 0) ? -1 : 1;
    }

    mode_ = mode;

    // Initialize file type, as it will also fill the tables
    boost::shared_ptr<CentralizedFileFormat> fileFormat(new CentralizedFileFormat);
    fileFormat->Init(directory, prefix, globalMetainfo_, fieldsTable_, offsetTable_);
    pFileFormat_ = fileFormat;

    // Clean the tables if mode is write
    if (mode_ == SerializerOpenModeWrite)
        pFileFormat_->CleanTables();
    else
        pFileFormat_->ImportTables();

    // Initiaize binary serializer
    binarySerializer_.Init();

    // Register basic metainfo
    if (!globalMetainfo_.HasKey("__format"))
        globalMetainfo_.AddMetainfo("__format", pFileFormat_->FormatName());
    //if (!globalMetainfo_.HasKey("__created"))
    //    globalMetainfo_.AddMetainfo("__created", /* TODO : add date (timestamp) */);
}